

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<135UL,_GF2::MOLex<135UL>_> * __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Rand(MP<135UL,_GF2::MOLex<135UL>_> *this)

{
  bool bVar1;
  u32 uVar2;
  MOLex<135UL> *in_RDI;
  MM<135UL> m;
  MM<135UL> *in_stack_ffffffffffffffb8;
  iterator local_30;
  _List_const_iterator<GF2::MM<135UL>_> in_stack_ffffffffffffffd8;
  list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *in_stack_ffffffffffffffe0;
  const_iterator in_stack_ffffffffffffffe8;
  
  SetEmpty((MP<135UL,_GF2::MOLex<135UL>_> *)0x17bd08);
  MM<135UL>::MM((MM<135UL> *)0x17bd12);
  do {
    uVar2 = Env::Rand();
    if ((uVar2 & 1) != 0) {
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                     ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)
                      in_stack_ffffffffffffffb8);
      std::_List_const_iterator<GF2::MM<135UL>_>::_List_const_iterator
                ((_List_const_iterator<GF2::MM<135UL>_> *)&stack0xffffffffffffffd8,&local_30);
      std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::insert
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
                 (value_type *)in_stack_ffffffffffffffd8._M_node);
    }
    bVar1 = MOLex<135UL>::Next(in_RDI,in_stack_ffffffffffffffb8);
  } while (bVar1);
  return (MP<135UL,_GF2::MOLex<135UL>_> *)in_RDI;
}

Assistant:

MP& Rand()
	{
		SetEmpty();
		MM<_n> m;
		do if (Env::Rand() & 1)
			insert(begin(), m);
		while (_order.Next(m));
		return *this;
	}